

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O2

void __thiscall MessageHandler::handleNotification(MessageHandler *this,Document *message)

{
  Type this_00;
  Ch *method;
  optional<NotificationHandler_*> oVar1;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  params;
  allocator<char> local_59;
  string local_58;
  optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_38;
  
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)message,"method");
  method = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"params",&local_59);
  getObject(&local_38,message,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  oVar1 = HandlerManager::getNotificationHandler(this->handlers,method);
  if (((undefined1  [16])oVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    (*((oVar1.value)->super_Handler)._vptr_Handler[1])(oVar1.value,&local_38);
  }
  return;
}

Assistant:

void MessageHandler::handleNotification (Document &message) {
    const char *method = message["method"].GetString();

    optional<Value> params = getObject(message, "params");

    optional<NotificationHandler *> handler = handlers->getNotificationHandler(method);

    if (handler) {
        (*handler)->run(params);
    } else {
//        Not handling a notification is hardly exceptional
//        std::cerr << "Unhandled notification " << method << "\n";
    }
}